

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool __thiscall QSslSocket::waitForEncrypted(QSslSocket *this,int msecs)

{
  bool bVar1;
  SocketState SVar2;
  int iVar3;
  undefined4 uVar4;
  QSslSocketPrivate *pQVar5;
  ulong uVar6;
  int in_ESI;
  QSslSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QElapsedTimer stopWatch;
  char *in_stack_ffffffffffffffb8;
  QTcpSocket *pQVar7;
  bool local_19;
  QElapsedTimer local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QSslSocket *)0x3a2bce);
  if ((pQVar5->plainSocket == (QTcpSocket *)0x0) || ((pQVar5->connectionEncrypted & 1U) != 0)) {
    local_19 = false;
  }
  else if ((pQVar5->mode == UnencryptedMode) && ((pQVar5->autoStartHandshake & 1U) == 0)) {
    local_19 = false;
  }
  else {
    bVar1 = QSslSocketPrivate::verifyProtocolSupported(in_RDI,in_stack_ffffffffffffffb8);
    if (bVar1) {
      local_18.t1 = -0x5555555555555556;
      local_18.t2 = -0x5555555555555556;
      QElapsedTimer::QElapsedTimer(&local_18);
      QElapsedTimer::start();
      SVar2 = QAbstractSocket::state((QAbstractSocket *)0x3a2c7c);
      if ((SVar2 == ConnectedState) ||
         (uVar6 = (**(code **)(*(long *)&pQVar5->plainSocket->super_QAbstractSocket + 0x130))
                            (pQVar5->plainSocket,in_ESI), (uVar6 & 1) != 0)) {
        do {
          if (((pQVar5->connectionEncrypted ^ 0xffU) & 1) == 0) {
            local_19 = (bool)(pQVar5->connectionEncrypted & 1);
            goto LAB_003a2d33;
          }
          if (pQVar5->mode == UnencryptedMode) {
            startClientEncryption((QSslSocket *)in_RDI);
          }
          pQVar7 = pQVar5->plainSocket;
          iVar3 = QElapsedTimer::elapsed();
          uVar4 = qt_subtract_from_timeout(in_ESI,iVar3);
          uVar6 = (**(code **)(*(long *)&pQVar7->super_QAbstractSocket + 0xb8))(pQVar7,uVar4);
        } while ((uVar6 & 1) != 0);
        local_19 = false;
      }
      else {
        local_19 = false;
      }
    }
    else {
      local_19 = false;
    }
  }
LAB_003a2d33:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool QSslSocket::waitForEncrypted(int msecs)
{
    Q_D(QSslSocket);
    if (!d->plainSocket || d->connectionEncrypted)
        return false;
    if (d->mode == UnencryptedMode && !d->autoStartHandshake)
        return false;
    if (!d->verifyProtocolSupported("QSslSocket::waitForEncrypted:"))
        return false;

    QElapsedTimer stopWatch;
    stopWatch.start();

    if (d->plainSocket->state() != QAbstractSocket::ConnectedState) {
        // Wait until we've entered connected state.
        if (!d->plainSocket->waitForConnected(msecs))
            return false;
    }

    while (!d->connectionEncrypted) {
        // Start the handshake, if this hasn't been started yet.
        if (d->mode == UnencryptedMode)
            startClientEncryption();
        // Loop, waiting until the connection has been encrypted or an error
        // occurs.
        if (!d->plainSocket->waitForReadyRead(qt_subtract_from_timeout(msecs, stopWatch.elapsed())))
            return false;
    }
    return d->connectionEncrypted;
}